

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O0

void __thiscall
absl::flags_internal::ReportUsageError(flags_internal *this,string_view msg,bool is_fatal)

{
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostream *__os;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  bool is_fatal_local;
  string_view msg_local;
  
  __os = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  __str._M_str = (char *)msg._M_len;
  __str._M_len = (size_t)this;
  this_00 = std::operator<<(__os,__str);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (((undefined1  [16])msg & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    sVar1._M_str = (char *)msg._M_len;
    sVar1._M_len = (size_t)this;
    AbslInternalReportFatalUsageError(sVar1);
  }
  return;
}

Assistant:

void ReportUsageError(absl::string_view msg, bool is_fatal) {
  std::cerr << "ERROR: " << msg << std::endl;

  if (is_fatal) {
    ABSL_INTERNAL_C_SYMBOL(AbslInternalReportFatalUsageError)(msg);
  }
}